

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuumEnergyAngle.test.cpp
# Opt level: O2

string * invalidLANG_abi_cxx11_(void)

{
  string *in_RDI;
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,
             " 5.000000-1 0.000000+0          4          2          1          29228 6  5     \n          2          1                                            9228 6  5     \n 0.000000+0 1.000000-5          0          1         12          49228 6  5     \n 1.000000+0 2.000000+0 3.000000+0 4.000000+0 5.000000+0 6.000000+09228 6  5     \n 7.000000+0 8.000000+0 9.000000+0 1.000000+1 1.100000+1 1.200000+19228 6  5     \n 0.000000+0 2.000000+7          0          1          6          29228 6  5     \n 1.000000+0 2.000000+0 3.000000+0 4.000000+0 5.000000+0 6.000000+09228 6  5     \n"
             ,&local_9);
  return in_RDI;
}

Assistant:

std::string invalidLANG() {
  return
    " 5.000000-1 0.000000+0          4          2          1          29228 6  5     \n"
    "          2          1                                            9228 6  5     \n"
    " 0.000000+0 1.000000-5          0          1         12          49228 6  5     \n"
    " 1.000000+0 2.000000+0 3.000000+0 4.000000+0 5.000000+0 6.000000+09228 6  5     \n"
    " 7.000000+0 8.000000+0 9.000000+0 1.000000+1 1.100000+1 1.200000+19228 6  5     \n"
    " 0.000000+0 2.000000+7          0          1          6          29228 6  5     \n"
    " 1.000000+0 2.000000+0 3.000000+0 4.000000+0 5.000000+0 6.000000+09228 6  5     \n";
}